

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  bool y;
  char blue [8];
  char local_21;
  char local_20 [8];
  
  builtin_strncpy(local_20,"\x1b[1;34m",8);
  sVar1 = strlen(local_20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_20,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8d6,0x3d);
  iVar2 = 10;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_90f,0x39);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::istream::_M_extract<bool>((bool *)&std::cin);
  if (local_21 == '\x01') {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"YESS...Uma ponte sob o abismo!",0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tente outra vez.",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  int x = 1;
  bool y;

  char blue[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << blue;

  do
  {
    cout << "O homem é uma ponte, atada entre o animal e o super homem..." << endl;
    x++;
    break;
  } while (x <= 20);

  cout << endl;
  cout << "--------------------------------------------------------------------------" << endl;
  cout << "Foi Nietzsche quem disse isso? digite (1)sim ou (0)não: " << endl;
  cin >> y;

  if (y == 1)
    {
      for (int i = 1; i <= 10; i++)
      {
        cout << "YESS...Uma ponte sob o abismo!" << endl;
      }
    }
    else
    {
      cout << "Tente outra vez." << endl;
    }

  return 0;
}